

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write_double<double>(BasicWriter<char> *this,double value,FormatSpec *spec)

{
  Alignment AVar1;
  wchar_t wVar2;
  char cVar3;
  uint uVar4;
  CharPtr pcVar5;
  byte *pbVar6;
  uint uVar7;
  char cVar8;
  size_t __len_1;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  Buffer<char> *pBVar13;
  ulong __n;
  size_t __len;
  ulong __n_00;
  byte code;
  bool bVar14;
  uint local_58;
  char format [10];
  
  code = spec->type_;
  uVar7 = code - 0x41;
  if (uVar7 < 0x27) {
    if ((0x71UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00122712;
      goto LAB_00122528;
    }
    bVar14 = true;
  }
  else {
LAB_00122712:
    if (code != 0) {
      internal::report_unknown_type(code,"double");
    }
    code = 0x67;
LAB_00122528:
    bVar14 = false;
  }
  if (0.0 <= value) {
    if ((spec->flags_ & 1) == 0) {
      cVar8 = '\0';
    }
    else {
      cVar8 = '+';
      if ((spec->flags_ & 2) == 0) {
        cVar8 = ' ';
      }
    }
  }
  else {
    value = -value;
    cVar8 = '-';
  }
  if (NAN(value)) {
    pcVar12 = " nan";
    if (bVar14) {
      pcVar12 = " NAN";
    }
    pcVar10 = " nan";
    if (bVar14) {
      pcVar10 = " NAN";
    }
    pcVar10 = pcVar10 + 1;
    if (cVar8 != '\0') {
      pcVar10 = pcVar12;
    }
    uVar11 = (ulong)(cVar8 != '\0');
LAB_001225b6:
    pcVar5 = write_str<char>(this,pcVar10,uVar11 + 3,&spec->super_AlignSpec);
    if (cVar8 != '\0') {
      *pcVar5 = cVar8;
    }
    return;
  }
  if (ABS(value) == INFINITY) {
    pcVar12 = " inf";
    if (bVar14) {
      pcVar12 = " INF";
    }
    pcVar10 = " inf";
    if (bVar14) {
      pcVar10 = " INF";
    }
    uVar11 = (ulong)(cVar8 != '\0');
    pcVar10 = pcVar10 + 1;
    if (cVar8 != '\0') {
      pcVar10 = pcVar12;
    }
    goto LAB_001225b6;
  }
  pBVar13 = this->buffer_;
  sVar9 = pBVar13->size_;
  uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (cVar8 != '\0') {
    if (pBVar13->capacity_ < (uVar7 + (uVar7 == 0)) + sVar9) {
      (**pBVar13->_vptr_Buffer)();
    }
    bVar14 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar14) {
      uVar7 = 0;
    }
    sVar9 = sVar9 + 1;
  }
  format[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pbVar6 = (byte *)(format + 1);
  }
  else {
    pbVar6 = (byte *)(format + 2);
    format[1] = '#';
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *pbVar6 = 0x2d;
      pbVar6 = pbVar6 + 1;
    }
    if (uVar7 != 0) {
      *pbVar6 = 0x2a;
      pbVar6 = pbVar6 + 1;
      goto LAB_00122655;
    }
  }
  uVar7 = 0;
LAB_00122655:
  if (-1 < spec->precision_) {
    pbVar6[0] = 0x2e;
    pbVar6[1] = 0x2a;
    pbVar6 = pbVar6 + 2;
  }
  *pbVar6 = code;
  pbVar6[1] = 0;
  wVar2 = (spec->super_AlignSpec).super_WidthSpec.fill_;
LAB_0012267c:
  do {
    pcVar12 = this->buffer_->ptr_ + sVar9;
    uVar4 = internal::CharTraits<char>::format_float<double>
                      (pcVar12,this->buffer_->capacity_ - sVar9,format,uVar7,spec->precision_,value)
    ;
    if ((int)uVar4 < 0) goto LAB_001226d0;
    pBVar13 = this->buffer_;
    if (uVar4 + sVar9 < pBVar13->capacity_) {
      if (cVar8 == '\0') {
        cVar8 = '\0';
      }
      else {
        AVar1 = (spec->super_AlignSpec).align_;
        if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
           (cVar3 = (char)wVar2, *pcVar12 != ' ')) {
          cVar3 = cVar8;
          cVar8 = '\0';
        }
        pcVar12[-1] = cVar3;
        uVar4 = uVar4 + 1;
      }
      if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
        uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
        if (uVar4 < uVar7) {
          pcVar5 = grow_buffer(this,(ulong)uVar7);
          __n = (ulong)uVar4;
          memmove(pcVar5 + (uVar7 - uVar4 >> 1),pcVar5,__n);
          uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
          uVar11 = uVar7 - __n;
          __n_00 = uVar11 >> 1;
          if (1 < uVar11) {
            local_58 = wVar2 & 0xff;
            memset(pcVar5,local_58,__n_00);
          }
          if (uVar7 == uVar4) {
            return;
          }
          memset(pcVar5 + __n + __n_00,wVar2 & 0xff,uVar11 - __n_00);
          return;
        }
      }
      if ((cVar8 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
        for (; *pcVar12 == ' '; pcVar12 = pcVar12 + 1) {
          *pcVar12 = (char)wVar2;
        }
        if (cVar8 != '\0') {
          pcVar12[-1] = cVar8;
        }
      }
      grow_buffer(this,(ulong)uVar4);
      return;
    }
    uVar11 = uVar4 + sVar9 + 1;
  } while (uVar11 <= pBVar13->capacity_);
  goto LAB_001226e4;
LAB_001226d0:
  pBVar13 = this->buffer_;
  if (pBVar13->capacity_ != 0xffffffffffffffff) {
    uVar11 = pBVar13->capacity_ + 1;
LAB_001226e4:
    (**pBVar13->_vptr_Buffer)(pBVar13,uVar11);
  }
  goto LAB_0012267c;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}